

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void * Eigen::internal::aligned_realloc(void *ptr,size_t new_size,size_t old_size)

{
  void *pvVar1;
  void *result;
  size_t old_size_local;
  size_t new_size_local;
  void *ptr_local;
  
  result = (void *)old_size;
  old_size_local = new_size;
  new_size_local = (size_t)ptr;
  ignore_unused_variable<unsigned_long>((unsigned_long *)&result);
  pvVar1 = realloc((void *)new_size_local,old_size_local);
  if ((pvVar1 == (void *)0x0) && (old_size_local != 0)) {
    throw_std_bad_alloc();
  }
  return pvVar1;
}

Assistant:

inline void* aligned_realloc(void *ptr, std::size_t new_size, std::size_t old_size)
{
  EIGEN_UNUSED_VARIABLE(old_size);

  void *result;
#if (EIGEN_DEFAULT_ALIGN_BYTES==0) || EIGEN_MALLOC_ALREADY_ALIGNED
  result = std::realloc(ptr,new_size);
#else
  result = handmade_aligned_realloc(ptr,new_size,old_size);
#endif

  if (!result && new_size)
    throw_std_bad_alloc();

  return result;
}